

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O0

int source_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  long *plVar1;
  FILE *__stream;
  byte bVar2;
  SRC_STATE *pSVar3;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 uStack_38;
  mixed_channel_t i;
  SRC_STATE *new;
  int e;
  pack_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  plVar1 = (long *)segment->data;
  if (field == 1) {
    if ((*value & 1) == 0) {
      segment->mix = source_segment_mix;
    }
    else {
      for (bVar2 = 0; bVar2 < *(byte *)(*plVar1 + 0x1c); bVar2 = bVar2 + 1) {
        mixed_buffer_clear((mixed_buffer *)plVar1[(ulong)bVar2 + 1]);
      }
      segment->mix = mix_noop;
    }
    value_local._4_4_ = 1;
  }
  else if (field == 3) {
    *(undefined4 *)(plVar1 + 0xf) = *value;
    value_local._4_4_ = 1;
  }
  else if (field == 4) {
    *(undefined4 *)((long)plVar1 + 0x7c) = *value;
    pSVar3 = src_new(uStack_38._4_4_,(int)uStack_38,(int *)CONCAT44(in_stack_ffffffffffffffc4,4));
    __stream = _stderr;
    if (pSVar3 == (SRC_STATE *)0x0) {
      pcVar4 = src_strerror(new._4_4_);
      fprintf(__stream,"libsamplerate: %s\n",pcVar4);
      mixed_err(1);
      value_local._4_4_ = 0;
    }
    else {
      src_delete((SRC_STATE *)CONCAT44(in_stack_ffffffffffffffc4,field));
      value_local._4_4_ = 1;
    }
  }
  else {
    mixed_err(7);
    value_local._4_4_ = 0;
  }
  return value_local._4_4_;
}

Assistant:

int source_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct pack_segment_data *data = (struct pack_segment_data *)segment->data;
  
  switch(field){
  case MIXED_RESAMPLE_TYPE: {
    int e;
    data->quality = *(enum mixed_resample_type *)value;
    // Always allocate it now ahead of start to catch errors in the value
    // or configuration.
    SRC_STATE *new = src_new(data->quality, data->pack->channels, &e);
    if(!new){
      fprintf(stderr, "libsamplerate: %s\n", src_strerror(e));
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
    src_delete(new);
  }
    return 1;
  case MIXED_VOLUME:
    data->target_volume = *((float *)value);
    return 1;
  case MIXED_BYPASS:
    if(*(bool *)value){
      for(mixed_channel_t i=0; i<data->pack->channels; ++i){
        mixed_buffer_clear(data->buffers[i]);
      }
      segment->mix = mix_noop;
    }else{
      segment->mix = source_segment_mix;
    }
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}